

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
::dx(FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
     *this,int i)

{
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  *pFVar1;
  Fad<double> *pFVar2;
  double *pdVar3;
  value_type vVar4;
  
  pFVar1 = this->left_;
  vVar4 = FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>
          ::dx(&((pFVar1->fadexpr_).right_)->fadexpr_,i);
  pFVar2 = (this->right_->fadexpr_).right_;
  pdVar3 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar3 = (pFVar2->dx_).ptr_to_data + i;
  }
  return vVar4 * (pFVar1->fadexpr_).left_.constant_ -
         *pdVar3 * (this->right_->fadexpr_).left_.constant_;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) - right_.dx(i);}